

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscachebackend.cpp
# Opt level: O0

int __thiscall
QNetworkAccessCacheBackend::open(QNetworkAccessCacheBackend *this,char *__file,int __oflag,...)

{
  bool bVar1;
  Operation OVar2;
  long in_FS_OFFSET;
  QString msg;
  NetworkError in_stack_ffffffffffffff6c;
  QNetworkAccessCacheBackend *value;
  undefined4 in_stack_ffffffffffffff80;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> in_stack_ffffffffffffff84
  ;
  undefined4 in_stack_ffffffffffffff88;
  Attribute in_stack_ffffffffffffff8c;
  QString *in_stack_ffffffffffffff90;
  char local_58 [22];
  QChar in_stack_ffffffffffffffbe;
  QNetworkAccessCacheBackend *in_stack_ffffffffffffffc0;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  value = this;
  OVar2 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)0x197110);
  if (OVar2 == GetOperation) {
    bVar1 = sendCacheContents(in_stack_ffffffffffffffc0);
    if (bVar1) {
      QVariant::QVariant(&local_28,true);
      QNetworkAccessBackend::setAttribute
                ((QNetworkAccessBackend *)
                 CONCAT44(in_stack_ffffffffffffff84.i,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff8c,(QVariant *)value);
      QVariant::~QVariant(&local_28);
      goto LAB_00197231;
    }
  }
  QCoreApplication::translate(local_58,"QNetworkAccessCacheBackend","Error opening %1",0);
  QNetworkAccessBackend::url(&value->super_QNetworkAccessBackend);
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
            ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
             &stack0xffffffffffffff84,PrettyDecoded);
  QUrl::toString((QUrlTwoFlags_conflict1 *)&stack0xffffffffffffff90);
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff82,L' ');
  QString::arg<QString,_true>
            (in_stack_ffffffffffffff90,
             (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff84.i,in_stack_ffffffffffffffbe);
  QString::~QString((QString *)0x1971d0);
  QUrl::~QUrl((QUrl *)&stack0xffffffffffffff88);
  QString::~QString((QString *)0x1971e4);
  QNetworkAccessBackend::error
            (&this->super_QNetworkAccessBackend,in_stack_ffffffffffffff6c,(QString *)0x1971f8);
  QString::~QString((QString *)0x197202);
LAB_00197231:
  QNetworkAccessBackend::finished((QNetworkAccessBackend *)0x19723b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessCacheBackend::open()
{
    if (operation() != QNetworkAccessManager::GetOperation || !sendCacheContents()) {
        QString msg = QCoreApplication::translate("QNetworkAccessCacheBackend", "Error opening %1")
                                                .arg(this->url().toString());
        error(QNetworkReply::ContentNotFoundError, msg);
    } else {
        setAttribute(QNetworkRequest::SourceIsFromCacheAttribute, true);
    }
    finished();
}